

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_proxy_revocable(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue val_00;
  JSValue this_obj;
  JSValue local_40;
  
  val = js_proxy_constructor(ctx,this_val,argc,argv);
  if ((int)val.tag == 6) {
    val_00 = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    local_40 = val;
    val_00 = JS_NewCFunctionData(ctx,js_proxy_revoke,0,0,1,&local_40);
    if (((int)val_00.tag != 6) && (this_obj = JS_NewObject(ctx), (int)this_obj.tag != 6)) {
      JS_DefinePropertyValue(ctx,this_obj,0x83,val,7);
      JS_DefinePropertyValue(ctx,this_obj,0x84,val_00,7);
      return this_obj;
    }
  }
  JS_FreeValue(ctx,val);
  JS_FreeValue(ctx,val_00);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_proxy_revocable(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue proxy_obj, revoke_obj = JS_UNDEFINED, obj;

    proxy_obj = js_proxy_constructor(ctx, JS_UNDEFINED, argc, argv);
    if (JS_IsException(proxy_obj))
        goto fail;
    revoke_obj = js_proxy_revoke_constructor(ctx, proxy_obj);
    if (JS_IsException(revoke_obj))
        goto fail;
    obj = JS_NewObject(ctx);
    if (JS_IsException(obj))
        goto fail;
    // XXX: exceptions?
    JS_DefinePropertyValue(ctx, obj, JS_ATOM_proxy, proxy_obj, JS_PROP_C_W_E);
    JS_DefinePropertyValue(ctx, obj, JS_ATOM_revoke, revoke_obj, JS_PROP_C_W_E);
    return obj;
 fail:
    JS_FreeValue(ctx, proxy_obj);
    JS_FreeValue(ctx, revoke_obj);
    return JS_EXCEPTION;
}